

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::RgbaInputFile::RgbaInputFile
          (RgbaInputFile *this,int partNumber,IStream *is,string *layerName,int numThreads)

{
  RgbaChannels rgbaChannels;
  MultiPartInputFile *this_00;
  InputPart *this_01;
  Header *header;
  FromYca *this_02;
  string local_50;
  
  this->_vptr_RgbaInputFile = (_func_int **)&PTR__RgbaInputFile_001e5fc0;
  this_00 = (MultiPartInputFile *)operator_new(0x20);
  MultiPartInputFile::MultiPartInputFile(this_00,is,numThreads,true);
  this->_multiPartFile = this_00;
  this->_inputPart = (InputPart *)0x0;
  this->_fromYca = (FromYca *)0x0;
  (this->_channelNamePrefix)._M_dataplus._M_p = (pointer)&(this->_channelNamePrefix).field_2;
  (this->_channelNamePrefix)._M_string_length = 0;
  (this->_channelNamePrefix).field_2._M_local_buf[0] = '\0';
  this_01 = (InputPart *)operator_new(8);
  InputPart::InputPart(this_01,this_00,partNumber);
  this->_inputPart = this_01;
  header = InputPart::header(this_01);
  anon_unknown_1::prefixFromLayerName(&local_50,layerName,header);
  std::__cxx11::string::operator=((string *)&this->_channelNamePrefix,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  rgbaChannels = channels(this);
  if ((WRITE_YA|WRITE_RGB) < rgbaChannels) {
    this_02 = (FromYca *)operator_new(0x188);
    FromYca::FromYca(this_02,this->_inputPart,rgbaChannels);
    this->_fromYca = this_02;
  }
  return;
}

Assistant:

RgbaInputFile::RgbaInputFile (
    int                                      partNumber,
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is,
    const string&                            layerName,
    int                                      numThreads)
    : _multiPartFile (new MultiPartInputFile (is, numThreads))
    , _inputPart (nullptr)
    , _fromYca (0)
{
    try
    {
        _inputPart = new InputPart (*_multiPartFile, partNumber);
        _channelNamePrefix =
            prefixFromLayerName (layerName, _inputPart->header ());
        RgbaChannels rgbaChannels = channels ();

        if (rgbaChannels & WRITE_C)
            _fromYca = new FromYca (*_inputPart, rgbaChannels);
    }
    catch (...)
    {
        if (_inputPart) { delete _inputPart; }
        delete _multiPartFile;
        throw;
    }
}